

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

void __thiscall HEkkDual::majorUpdatePrimal(HEkkDual *this)

{
  HEkkDualRHS *this_00;
  __atomic_base<int> _Var1;
  double dVar2;
  EdgeWeightMode EVar3;
  int iVar4;
  int iVar5;
  HVector *column;
  HEkk *pHVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  element_type *peVar10;
  bool bVar11;
  char *pcVar12;
  HighsSplitDeque *pHVar13;
  uint uVar14;
  uint32_t uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  vector<double,_std::allocator<double>_> *pvVar23;
  HVector_ptr *ppHVar24;
  MFinish *pMVar25;
  double *pdVar26;
  ulong uVar27;
  double dVar28;
  double dVar29;
  TaskGroup tg;
  undefined1 local_d0 [16];
  anon_class_40_5_b11b0fa6 *local_c0;
  long local_b8;
  double new_pivotal_edge_weight;
  anon_class_40_5_b11b0fa6 local_a8;
  MFinish *local_80;
  double Kai;
  double *dseArray;
  double *colArray;
  double *local_work_infeasibility;
  double *mixArray;
  string local_50;
  
  this_00 = &this->dualRHS;
  if ((this->dualRHS).workCount < 0) {
    mixArray = (this->col_BFRT).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_d0._8_8_ = &mixArray;
    local_work_infeasibility =
         (this->dualRHS).work_infeasibility.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_c0 = (anon_class_40_5_b11b0fa6 *)&local_work_infeasibility;
    uVar17 = this->solver_num_row;
    local_d0._0_8_ = this;
    if ((int)uVar17 < 0x65) {
      majorUpdatePrimal::anon_class_24_3_f997d2ca::operator()
                ((anon_class_24_3_f997d2ca *)local_d0,0,uVar17);
    }
    else {
      tg.workerDeque = HighsTaskExecutor::getThisWorkerDeque();
      tg.dequeHead = ((tg.workerDeque)->ownerData).head;
      do {
        pHVar13 = tg.workerDeque;
        uVar18 = uVar17 >> 1;
        local_a8.colArray = (double **)CONCAT44(uVar17,uVar18);
        local_a8.edge_weight =
             (vector<double,_std::allocator<double>_> *)CONCAT44(local_a8.edge_weight._4_4_,100);
        uVar14 = ((tg.workerDeque)->ownerData).head;
        uVar16 = (ulong)uVar14;
        local_a8.new_pivotal_edge_weight = (double *)local_d0;
        if (uVar16 < 0x2000) {
          uVar15 = (uint32_t)(uVar16 + 1);
          ((tg.workerDeque)->ownerData).head = uVar15;
          ((tg.workerDeque)->taskArray)._M_elems[uVar16].metadata.stealer.
          super___atomic_base<unsigned_long>._M_i = 0;
          *(undefined ***)((tg.workerDeque)->taskArray)._M_elems[uVar16].taskData =
               &PTR_operator___004336f8;
          *(undefined1 **)(((tg.workerDeque)->taskArray)._M_elems[uVar16].taskData + 0x18) =
               local_d0;
          pcVar12 = ((tg.workerDeque)->taskArray)._M_elems[uVar16].taskData;
          *(double ***)(pcVar12 + 8) = local_a8.colArray;
          *(vector<double,_std::allocator<double>_> **)(pcVar12 + 0x10) = local_a8.edge_weight;
          if (((tg.workerDeque)->ownerData).allStolenCopy == true) {
            ((tg.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                 uVar16 << 0x20 | uVar16 + 1;
            ((tg.workerDeque)->stealerData).allStolen._M_base._M_i = false;
            ((tg.workerDeque)->ownerData).splitCopy = uVar15;
            ((tg.workerDeque)->ownerData).allStolenCopy = false;
            if ((((tg.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
              ((tg.workerDeque)->splitRequest)._M_base._M_i = false;
            }
            peVar10 = ((tg.workerDeque)->ownerData).workerBunk.
                      super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            LOCK();
            _Var1._M_i = (peVar10->haveJobs).super___atomic_base<int>._M_i;
            (peVar10->haveJobs).super___atomic_base<int>._M_i =
                 (peVar10->haveJobs).super___atomic_base<int>._M_i + 1;
            UNLOCK();
            if (_Var1._M_i < ((tg.workerDeque)->ownerData).numWorkers + -1) {
              HighsSplitDeque::WorkerBunk::publishWork
                        (((tg.workerDeque)->ownerData).workerBunk.
                         super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,tg.workerDeque);
            }
          }
          else {
            HighsSplitDeque::growShared(tg.workerDeque);
          }
        }
        else {
          if ((((tg.workerDeque)->ownerData).splitCopy < 0x2000) &&
             (((tg.workerDeque)->ownerData).allStolenCopy == false)) {
            HighsSplitDeque::growShared(tg.workerDeque);
            uVar14 = (pHVar13->ownerData).head;
          }
          (pHVar13->ownerData).head = uVar14 + 1;
          HighsTask::
          Callable<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/parallel/HighsParallel.h:118:16)>
          ::anon_class_24_4_3f80b2e7_for_functor::operator()
                    ((anon_class_24_4_3f80b2e7_for_functor *)&local_a8);
        }
        bVar11 = 0xc9 < uVar17;
        uVar17 = uVar18;
      } while (bVar11);
      majorUpdatePrimal::anon_class_24_3_f997d2ca::operator()
                ((anon_class_24_3_f997d2ca *)local_d0,0,uVar18);
      ::highs::parallel::TaskGroup::taskWait(&tg);
      ::highs::parallel::TaskGroup::~TaskGroup(&tg);
    }
    if ((this->edge_weight_mode == kSteepestEdge) ||
       ((this->edge_weight_mode == kDevex && (this->new_devex_framework == false)))) {
      pvVar23 = &this->ekk_instance_->dual_edge_weight_;
      pMVar25 = this->multi_finish;
      local_80 = pMVar25;
      for (lVar22 = 0; lVar22 < this->multi_nFinish; lVar22 = lVar22 + 1) {
        new_pivotal_edge_weight = pMVar25[lVar22].EdWt;
        colArray = ((pMVar25[lVar22].col_aq)->array).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (this->edge_weight_mode == kSteepestEdge) {
          dseArray = ((pMVar25[lVar22].row_ep)->array).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          Kai = -2.0 / pMVar25[lVar22].alpha_row;
          uVar17 = this->solver_num_row;
          local_a8.colArray = &colArray;
          local_a8.new_pivotal_edge_weight = &new_pivotal_edge_weight;
          local_a8.Kai = &Kai;
          local_a8.dseArray = &dseArray;
          local_b8 = lVar22;
          local_a8.edge_weight = pvVar23;
          if ((int)uVar17 < 0x65) {
            majorUpdatePrimal::anon_class_40_5_b11b0fa6::operator()(&local_a8,0,uVar17);
            lVar22 = local_b8;
          }
          else {
            tg.workerDeque = HighsTaskExecutor::getThisWorkerDeque();
            tg.dequeHead = ((tg.workerDeque)->ownerData).head;
            do {
              pHVar13 = tg.workerDeque;
              uVar18 = uVar17 >> 1;
              local_d0._4_4_ = uVar17;
              local_d0._0_4_ = uVar18;
              local_d0._8_4_ = 100;
              uVar14 = ((tg.workerDeque)->ownerData).head;
              uVar16 = (ulong)uVar14;
              local_c0 = &local_a8;
              if (uVar16 < 0x2000) {
                uVar15 = (uint32_t)(uVar16 + 1);
                ((tg.workerDeque)->ownerData).head = uVar15;
                ((tg.workerDeque)->taskArray)._M_elems[uVar16].metadata.stealer.
                super___atomic_base<unsigned_long>._M_i = 0;
                *(undefined ***)((tg.workerDeque)->taskArray)._M_elems[uVar16].taskData =
                     &PTR_operator___00433758;
                *(anon_class_40_5_b11b0fa6 **)
                 (((tg.workerDeque)->taskArray)._M_elems[uVar16].taskData + 0x18) = &local_a8;
                pcVar12 = ((tg.workerDeque)->taskArray)._M_elems[uVar16].taskData;
                *(undefined8 *)(pcVar12 + 8) = local_d0._0_8_;
                *(undefined8 *)(pcVar12 + 0x10) = local_d0._8_8_;
                if (((tg.workerDeque)->ownerData).allStolenCopy == true) {
                  ((tg.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                       uVar16 << 0x20 | uVar16 + 1;
                  ((tg.workerDeque)->stealerData).allStolen._M_base._M_i = false;
                  ((tg.workerDeque)->ownerData).splitCopy = uVar15;
                  ((tg.workerDeque)->ownerData).allStolenCopy = false;
                  if ((((tg.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                    ((tg.workerDeque)->splitRequest)._M_base._M_i = false;
                  }
                  peVar10 = ((tg.workerDeque)->ownerData).workerBunk.
                            super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  LOCK();
                  _Var1._M_i = (peVar10->haveJobs).super___atomic_base<int>._M_i;
                  (peVar10->haveJobs).super___atomic_base<int>._M_i =
                       (peVar10->haveJobs).super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                  if (_Var1._M_i < ((tg.workerDeque)->ownerData).numWorkers + -1) {
                    HighsSplitDeque::WorkerBunk::publishWork
                              (((tg.workerDeque)->ownerData).workerBunk.
                               super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,tg.workerDeque);
                  }
                }
                else {
                  HighsSplitDeque::growShared(tg.workerDeque);
                }
              }
              else {
                if ((((tg.workerDeque)->ownerData).splitCopy < 0x2000) &&
                   (((tg.workerDeque)->ownerData).allStolenCopy == false)) {
                  HighsSplitDeque::growShared(tg.workerDeque);
                  uVar14 = (pHVar13->ownerData).head;
                }
                (pHVar13->ownerData).head = uVar14 + 1;
                HighsTask::
                Callable<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/parallel/HighsParallel.h:118:16)>
                ::anon_class_24_4_3f80b2e7_for_functor::operator()
                          ((anon_class_24_4_3f80b2e7_for_functor *)local_d0);
              }
              bVar11 = 0xc9 < uVar17;
              uVar17 = uVar18;
            } while (bVar11);
            majorUpdatePrimal::anon_class_40_5_b11b0fa6::operator()(&local_a8,0,uVar18);
            ::highs::parallel::TaskGroup::taskWait(&tg);
            ::highs::parallel::TaskGroup::~TaskGroup(&tg);
            lVar22 = local_b8;
            pMVar25 = local_80;
          }
        }
        else {
          uVar16 = (ulong)(uint)this->solver_num_row;
          if (this->solver_num_row < 1) {
            uVar16 = 0;
          }
          for (uVar19 = 0; uVar16 != uVar19; uVar19 = uVar19 + 1) {
            pdVar7 = (pvVar23->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            dVar28 = new_pivotal_edge_weight * colArray[uVar19] * colArray[uVar19];
            dVar2 = pdVar7[uVar19];
            if (dVar28 <= dVar2) {
              dVar28 = dVar2;
            }
            pdVar7[uVar19] = dVar28;
          }
        }
      }
    }
  }
  else {
    HEkkDualRHS::updatePrimal(this_00,&this->col_BFRT,1.0);
    HEkkDualRHS::updateInfeasList(this_00,&this->col_BFRT);
    ppHVar24 = &this->multi_finish[0].col_aq;
    for (lVar22 = 0; lVar22 < this->multi_nFinish; lVar22 = lVar22 + 1) {
      column = *ppHVar24;
      if (this->edge_weight_mode == kDevex) {
        if (this->new_devex_framework == false) {
          HEkk::updateDualDevexWeights(this->ekk_instance_,column,(double)ppHVar24[-2]);
        }
      }
      else if (this->edge_weight_mode == kSteepestEdge) {
        HEkk::updateDualSteepestEdgeWeights
                  (this->ekk_instance_,this->row_out,this->variable_in,column,(double)ppHVar24[-2],
                   -2.0 / (double)ppHVar24[-6],
                   (ppHVar24[-1]->array).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start);
      }
      HEkkDualRHS::updateInfeasList(this_00,column);
      ppHVar24 = ppHVar24 + 0xf;
    }
  }
  pdVar26 = &this->multi_finish[0].basicValue;
  for (lVar22 = 0; uVar17 = this->multi_nFinish, lVar22 < (int)uVar17; lVar22 = lVar22 + 1) {
    HEkkDualRHS::updatePivots
              (this_00,*(int *)(pdVar26 + -5),
               (this->baseValue[*(int *)(pdVar26 + -5)] - pdVar26[-1]) + *pdVar26);
    pdVar26 = pdVar26 + 0xf;
  }
  EVar3 = this->edge_weight_mode;
  if (EVar3 == kDevex) {
    if (this->new_devex_framework != false) goto LAB_0033de69;
  }
  else if (EVar3 != kSteepestEdge) goto LAB_0033de69;
  pHVar6 = this->ekk_instance_;
  uVar19 = 0;
  uVar16 = (ulong)uVar17;
  if ((int)uVar17 < 1) {
    uVar16 = uVar19;
  }
  iVar20 = this->num_devex_iterations;
  for (uVar21 = 0; uVar21 != uVar16; uVar21 = uVar21 + 1) {
    iVar4 = this->multi_finish[uVar21].row_out;
    dVar2 = this->multi_finish[uVar21].EdWt;
    pdVar7 = ((this->multi_finish[uVar21].col_aq)->array).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (EVar3 == kSteepestEdge) {
      pdVar8 = ((this->multi_finish[uVar21].row_ep)->array).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      dVar28 = this->multi_finish[uVar21].alpha_row;
      for (uVar27 = 0; uVar19 != uVar27; uVar27 = uVar27 + 0x78) {
        iVar5 = *(int *)((long)&this->multi_finish[0].row_out + uVar27);
        dVar29 = pdVar7[iVar5];
        pdVar9 = (pHVar6->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar29 = (dVar2 * dVar29 + pdVar8[iVar5] * (-2.0 / dVar28)) * dVar29 + pdVar9[iVar5];
        if (dVar29 <= 0.0001) {
          dVar29 = 0.0001;
        }
        pdVar9[iVar5] = dVar29;
      }
      (pHVar6->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = dVar2;
    }
    else {
      for (uVar27 = 0; uVar19 != uVar27; uVar27 = uVar27 + 0x78) {
        iVar5 = *(int *)((long)&this->multi_finish[0].row_out + uVar27);
        dVar28 = pdVar7[iVar4];
        pdVar8 = (pHVar6->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar28 = dVar2 * dVar28 * dVar28;
        dVar29 = pdVar8[iVar5];
        if (dVar28 <= dVar29) {
          dVar28 = dVar29;
        }
        pdVar8[iVar5] = dVar28;
      }
      (pHVar6->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = dVar2;
      iVar20 = iVar20 + 1;
      this->num_devex_iterations = iVar20;
    }
    uVar19 = uVar19 + 0x78;
  }
LAB_0033de69:
  std::__cxx11::string::string((string *)&local_50,"999",(allocator *)&local_a8);
  checkNonUnitWeightError(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void HEkkDual::majorUpdatePrimal() {
  const bool updatePrimal_inDense = dualRHS.workCount < 0;
  if (updatePrimal_inDense) {
    // Dense update of primal values, infeasibility list and
    // non-pivotal edge weights
    const double* mixArray = col_BFRT.array.data();
    double* local_work_infeasibility = dualRHS.work_infeasibility.data();
    // #pragma omp parallel for schedule(static)
    highs::parallel::for_each(
        0, solver_num_row,
        [&](HighsInt start, HighsInt end) {
          for (HighsInt iRow = start; iRow < end; iRow++) {
            baseValue[iRow] -= mixArray[iRow];
            const double value = baseValue[iRow];
            const double less = baseLower[iRow] - value;
            const double more = value - baseUpper[iRow];
            double infeas = less > Tp ? less : (more > Tp ? more : 0);
            if (ekk_instance_.info_.store_squared_primal_infeasibility)
              local_work_infeasibility[iRow] = infeas * infeas;
            else
              local_work_infeasibility[iRow] = fabs(infeas);
          }
        },
        100);

    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge ||
        (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework)) {
      // Dense update of any edge weights (except weights for pivotal rows)
      std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
      for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
        // multi_finish[iFn].EdWt has already been transformed to correspond to
        // the new basis
        const double new_pivotal_edge_weight = multi_finish[iFn].EdWt;
        const double* colArray = multi_finish[iFn].col_aq->array.data();
        if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
          // Update steepest edge weights
          const double* dseArray = multi_finish[iFn].row_ep->array.data();
          const double Kai = -2 / multi_finish[iFn].alpha_row;
          // #pragma omp parallel for schedule(static)
          highs::parallel::for_each(
              0, solver_num_row,
              [&](HighsInt start, HighsInt end) {
                for (HighsInt iRow = start; iRow < end; iRow++) {
                  const double aa_iRow = colArray[iRow];
                  edge_weight[iRow] +=
                      aa_iRow * (new_pivotal_edge_weight * aa_iRow +
                                 Kai * dseArray[iRow]);
                  edge_weight[iRow] =
                      max(kMinDualSteepestEdgeWeight, edge_weight[iRow]);
                }
              },
              100);
        } else {
          // Update Devex weights
          for (HighsInt iRow = 0; iRow < solver_num_row; iRow++) {
            const double aa_iRow = colArray[iRow];
            edge_weight[iRow] = max(
                edge_weight[iRow], new_pivotal_edge_weight * aa_iRow * aa_iRow);
          }
        }
      }
    }
  } else {
    // Sparse update of primal values, infeasibility list and
    // non-pivotal edge weights
    dualRHS.updatePrimal(&col_BFRT, 1);
    dualRHS.updateInfeasList(&col_BFRT);

    // Sparse update of any edge weights and infeasList. Weights for
    // rows pivotal in this set of MI are updated, but this is based
    // on the previous updated weights not the computed pivotal weight
    // that's known. For the rows pivotal in this set of MI, the
    // weights will be over-written in the next section of code.
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      MFinish* finish = &multi_finish[iFn];
      HVector* Col = finish->col_aq;
      const double new_pivotal_edge_weight = finish->EdWt;
      if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
        // Update steepest edge weights
        HVector* Row = finish->row_ep;
        double Kai = -2 / finish->alpha_row;
        ekk_instance_.updateDualSteepestEdgeWeights(row_out, variable_in, Col,
                                                    new_pivotal_edge_weight,
                                                    Kai, Row->array.data());
      } else if (edge_weight_mode == EdgeWeightMode::kDevex &&
                 !new_devex_framework) {
        // Update Devex weights
        ekk_instance_.updateDualDevexWeights(Col, new_pivotal_edge_weight);
      }
      dualRHS.updateInfeasList(Col);
    }
  }

  // Update primal value for the rows pivotal in this set of MI
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HighsInt iRow = finish->row_out;
    double value = baseValue[iRow] - finish->basicBound + finish->basicValue;
    dualRHS.updatePivots(iRow, value);
  }

  // Update any edge weights for the rows pivotal in this set of MI.
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge ||
      (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework)) {
    // Update weights for the pivots using the computed values.
    std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      const HighsInt iRow = multi_finish[iFn].row_out;
      const double new_pivotal_edge_weight = multi_finish[iFn].EdWt;
      const double* colArray = multi_finish[iFn].col_aq->array.data();
      // The weight for this pivot is known, but weights for rows
      // pivotal earlier need to be updated
      if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
        // Steepest edge
        const double* dseArray = multi_finish[iFn].row_ep->array.data();
        double Kai = -2 / multi_finish[iFn].alpha_row;
        for (HighsInt jFn = 0; jFn < iFn; jFn++) {
          HighsInt jRow = multi_finish[jFn].row_out;
          double value = colArray[jRow];
          edge_weight[jRow] +=
              value * (new_pivotal_edge_weight * value + Kai * dseArray[jRow]);
          edge_weight[jRow] =
              max(kMinDualSteepestEdgeWeight, edge_weight[jRow]);
        }
        edge_weight[iRow] = new_pivotal_edge_weight;
      } else {
        // Devex
        for (HighsInt jFn = 0; jFn < iFn; jFn++) {
          HighsInt jRow = multi_finish[jFn].row_out;
          const double aa_iRow = colArray[iRow];
          edge_weight[jRow] = max(edge_weight[jRow],
                                  new_pivotal_edge_weight * aa_iRow * aa_iRow);
        }
        edge_weight[iRow] = new_pivotal_edge_weight;
        num_devex_iterations++;
      }
    }
  }
  checkNonUnitWeightError("999");
}